

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::ArraySpliceHelper<double>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  code *pcVar1;
  SparseArraySegment<double> *this;
  Type *pTVar2;
  JavascriptArray *pnewArr_00;
  bool bVar3;
  uint uVar4;
  uint32 uVar5;
  SparseArraySegmentBase **ppSVar6;
  undefined4 *puVar7;
  Type *prev;
  SparseArraySegmentBase *pSVar8;
  uint32 relativeStart;
  bool isInlineSegment;
  SparseArraySegment<double> *oldSegInsert;
  SparseArraySegmentBase *pSStack_c0;
  uint32 spaceLeft;
  SparseArraySegment<double> *segInsert;
  uint32 local_b0;
  byte local_a9;
  uint32 headDeleteLen_2;
  bool dummyHeadNodeInserted;
  SparseArraySegmentBase *local_a0;
  SparseArraySegmentBase *temp;
  nullptr_t pvStack_90;
  uint32 headDeleteLen_1;
  uint32 local_84;
  Type *pTStack_80;
  uint32 headDeleteLen;
  Type *prevNewHeadSeg;
  SparseArraySegment<double> *newHeadSeg;
  SparseArraySegmentBase *nextSeg;
  uint32 local_60;
  uint uStack_5c;
  bool hasInlineSegment;
  uint32 rightLimit;
  uint32 limit;
  SparseArraySegment<double> *startSeg;
  SparseArraySegmentBase *savePrev;
  Type *prevPrevSeg;
  Type *prevSeg;
  Recycler *recycler;
  Var *ppvStack_28;
  uint32 insertLen_local;
  Var *insertArgs_local;
  uint32 deleteLen_local;
  uint32 start_local;
  JavascriptArray *pArr_local;
  JavascriptArray *pnewArr_local;
  
  recycler._4_4_ = insertLen;
  ppvStack_28 = insertArgs;
  insertArgs_local._0_4_ = deleteLen;
  insertArgs_local._4_4_ = start;
  _deleteLen_local = pArr;
  pArr_local = pnewArr;
  prevSeg = (Type *)ScriptContext::GetRecycler(scriptContext);
  prevPrevSeg = &_deleteLen_local->head;
  savePrev = (SparseArraySegmentBase *)&_deleteLen_local->head;
  startSeg = (SparseArraySegment<double> *)0x0;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&_deleteLen_local->head);
  if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  EnsureHead<double>(_deleteLen_local);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&_deleteLen_local->head);
  _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
  uStack_5c = insertArgs_local._4_4_ + (uint32)insertArgs_local;
  bVar3 = UInt32Math::Add(((SparseArraySegmentBase *)&_rightLimit->left)->left,_rightLimit->size,
                          &local_60);
  if (bVar3) {
    local_60 = 0xffffffff;
  }
  while (_rightLimit != (SparseArraySegmentBase *)0x0 && local_60 <= insertArgs_local._4_4_) {
    startSeg = (SparseArraySegment<double> *)_rightLimit;
    savePrev = (SparseArraySegmentBase *)prevPrevSeg;
    prevPrevSeg = &_rightLimit->next;
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
    if ((_rightLimit != (SparseArraySegmentBase *)0x0) &&
       (bVar3 = UInt32Math::Add(((SparseArraySegmentBase *)&_rightLimit->left)->left,
                                _rightLimit->size,&local_60), bVar3)) {
      local_60 = 0xffffffff;
    }
  }
  nextSeg._7_1_ = IsInlineSegment(_rightLimit,_deleteLen_local);
  if (_rightLimit == (SparseArraySegmentBase *)0x0) goto LAB_010fb138;
  if ((((SparseArraySegmentBase *)&_rightLimit->left)->left <= insertArgs_local._4_4_) &&
     (uStack_5c <= ((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length)) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    pnewArr_00 = pArr_local;
    pSVar8 = _rightLimit;
    newHeadSeg = (SparseArraySegment<double> *)*ppSVar6;
    prev = SparseArraySegment<double>::AddressFrom(prevPrevSeg);
    ArraySegmentSpliceHelper<double>
              (pnewArr_00,(SparseArraySegment<double> *)pSVar8,prev,insertArgs_local._4_4_,
               (uint32)insertArgs_local,ppvStack_28,recycler._4_4_,(Recycler *)prevSeg);
    while (newHeadSeg != (SparseArraySegment<double> *)0x0) {
      (newHeadSeg->super_SparseArraySegmentBase).left =
           ((newHeadSeg->super_SparseArraySegmentBase).left - (uint32)insertArgs_local) +
           recycler._4_4_;
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&(newHeadSeg->super_SparseArraySegmentBase).next);
      if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
        SparseArraySegmentBase::EnsureSizeInBound(&newHeadSeg->super_SparseArraySegmentBase);
      }
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&(newHeadSeg->super_SparseArraySegmentBase).next);
      newHeadSeg = (SparseArraySegment<double> *)*ppSVar6;
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)prevPrevSeg);
    if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
      return;
    }
    pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(prevPrevSeg);
    SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
    return;
  }
  prevNewHeadSeg = (Type *)0x0;
  pTStack_80 = &pArr_local->head;
  if (((SparseArraySegmentBase *)&_rightLimit->left)->left < insertArgs_local._4_4_) {
    if (insertArgs_local._4_4_ <
        ((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length) {
      local_84 = (((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length) -
                 insertArgs_local._4_4_;
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&_rightLimit->next);
      if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
        prevNewHeadSeg =
             (Type *)SparseArraySegment<double>::AllocateSegment
                               ((Recycler *)prevSeg,0,local_84,local_84,
                                (SparseArraySegmentBase *)0x0);
      }
      else {
        prevNewHeadSeg =
             (Type *)SparseArraySegment<double>::AllocateSegmentImpl<false>
                               ((Recycler *)prevSeg,0,local_84,local_84,
                                (SparseArraySegmentBase *)0x0);
      }
      prevNewHeadSeg =
           (Type *)SparseArraySegment<double>::CopySegment
                             ((Recycler *)prevSeg,(SparseArraySegment<double> *)prevNewHeadSeg,0,
                              (SparseArraySegment<double> *)_rightLimit,insertArgs_local._4_4_,
                              local_84);
      pvStack_90 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                (&(((SparseArraySegment<double> *)prevNewHeadSeg)->super_SparseArraySegmentBase).
                  next,&stack0xffffffffffffff70);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                (pTStack_80,(SparseArraySegmentBase *)prevNewHeadSeg);
      pTStack_80 = prevNewHeadSeg + 2;
      SparseArraySegment<double>::Truncate
                ((SparseArraySegment<double> *)_rightLimit,insertArgs_local._4_4_);
    }
    startSeg = (SparseArraySegment<double> *)_rightLimit;
    savePrev = (SparseArraySegmentBase *)prevPrevSeg;
    prevPrevSeg = &_rightLimit->next;
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
  }
  else if (((bool)nextSeg._7_1_) && (_rightLimit != (SparseArraySegmentBase *)0x0)) {
    if ((insertArgs_local._4_4_ < ((SparseArraySegmentBase *)&_rightLimit->left)->left) ||
       (((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length <=
        insertArgs_local._4_4_)) {
      if ((((SparseArraySegmentBase *)&_rightLimit->left)->left == 0) && (_rightLimit->length == 0))
      {
        if (_rightLimit->size == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                  (prevPrevSeg,&_rightLimit->next);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&_rightLimit->next);
        _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
      }
    }
    else {
      temp._4_4_ = (((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length) -
                   insertArgs_local._4_4_;
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&_rightLimit->next);
      if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
        prevNewHeadSeg =
             (Type *)SparseArraySegment<double>::AllocateSegment
                               ((Recycler *)prevSeg,0,temp._4_4_,temp._4_4_,
                                (SparseArraySegmentBase *)0x0);
      }
      else {
        prevNewHeadSeg =
             (Type *)SparseArraySegment<double>::AllocateSegmentImpl<false>
                               ((Recycler *)prevSeg,0,temp._4_4_,temp._4_4_,
                                (SparseArraySegmentBase *)0x0);
      }
      prevNewHeadSeg =
           (Type *)SparseArraySegment<double>::CopySegment
                             ((Recycler *)prevSeg,(SparseArraySegment<double> *)prevNewHeadSeg,0,
                              (SparseArraySegment<double> *)_rightLimit,insertArgs_local._4_4_,
                              temp._4_4_);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                (pTStack_80,(SparseArraySegmentBase *)prevNewHeadSeg);
      pTStack_80 = prevNewHeadSeg + 2;
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(prevPrevSeg,&_rightLimit->next)
      ;
      (*(_deleteLen_local->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                (_deleteLen_local,_rightLimit,0);
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&_rightLimit->next);
      _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
    }
  }
  local_a0 = (SparseArraySegmentBase *)0x0;
  while( true ) {
    bVar3 = false;
    if (_rightLimit != (SparseArraySegmentBase *)0x0) {
      bVar3 = ((SparseArraySegmentBase *)&_rightLimit->left)->left + _rightLimit->length <=
              uStack_5c;
    }
    if (!bVar3) break;
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    local_a0 = *ppSVar6;
    ((SparseArraySegmentBase *)&_rightLimit->left)->left =
         ((SparseArraySegmentBase *)&_rightLimit->left)->left - insertArgs_local._4_4_;
    _headDeleteLen_2 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&_rightLimit->next,(nullptr_t *)&headDeleteLen_2);
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(pTStack_80,_rightLimit);
    pTStack_80 = &_rightLimit->next;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(prevPrevSeg,local_a0);
    _rightLimit = local_a0;
  }
  local_a9 = 0;
  if ((startSeg == (SparseArraySegment<double> *)0x0) &&
     ((_rightLimit == (SparseArraySegmentBase *)0x0 ||
      (((SparseArraySegmentBase *)&_rightLimit->left)->left != 0)))) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_deleteLen_local->head);
    if (*ppSVar6 != _rightLimit) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    EnsureHeadStartsFromZero<double>(_deleteLen_local,(Recycler *)prevSeg);
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_deleteLen_local->head);
    if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
LAB_010fae40:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    else {
      pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                         (&_deleteLen_local->head);
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&pSVar8->next);
      if (*ppSVar6 != _rightLimit) goto LAB_010fae40;
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_deleteLen_local->head);
    startSeg = (SparseArraySegment<double> *)*ppSVar6;
    savePrev = (SparseArraySegmentBase *)prevPrevSeg;
    pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                       (&_deleteLen_local->head);
    prevPrevSeg = &pSVar8->next;
    local_a9 = 1;
  }
  if ((_rightLimit != (SparseArraySegmentBase *)0x0) &&
     (((SparseArraySegmentBase *)&_rightLimit->left)->left < uStack_5c)) {
    local_b0 = (insertArgs_local._4_4_ + (uint32)insertArgs_local) -
               ((SparseArraySegmentBase *)&_rightLimit->left)->left;
    prevNewHeadSeg =
         (Type *)SparseArraySegment<double>::AllocateSegment
                           ((Recycler *)prevSeg,
                            ((SparseArraySegmentBase *)&_rightLimit->left)->left -
                            insertArgs_local._4_4_,local_b0,(SparseArraySegmentBase *)0x0);
    prevNewHeadSeg =
         (Type *)SparseArraySegment<double>::CopySegment
                           ((Recycler *)prevSeg,(SparseArraySegment<double> *)prevNewHeadSeg,
                            _rightLimit->left - insertArgs_local._4_4_,
                            (SparseArraySegment<double> *)_rightLimit,_rightLimit->left,local_b0);
    segInsert = (SparseArraySegment<double> *)0x0;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&(((SparseArraySegment<double> *)prevNewHeadSeg)->super_SparseArraySegmentBase).next,
               &segInsert);
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (pTStack_80,(SparseArraySegmentBase *)prevNewHeadSeg);
    pTStack_80 = prevNewHeadSeg + 2;
    Memory::MoveArray<double,double,Memory::Recycler>
              ((double *)(_rightLimit + 1),(double *)(&_rightLimit[1].left + (ulong)local_b0 * 2),
               (ulong)(_rightLimit->length - local_b0));
    _rightLimit->left = _rightLimit->left + local_b0;
    _rightLimit->length = _rightLimit->length - local_b0;
    SparseArraySegmentBase::CheckLengthvsSize(_rightLimit);
    SparseArraySegment<double>::Truncate
              ((SparseArraySegment<double> *)_rightLimit,_rightLimit->left + _rightLimit->length);
    SparseArraySegmentBase::EnsureSizeInBound(_rightLimit);
  }
  if (((_rightLimit != (SparseArraySegmentBase *)0x0) &&
      ((((SparseArraySegmentBase *)&_rightLimit->left)->left - (uint32)insertArgs_local) +
       recycler._4_4_ == 0)) && ((local_a9 & 1) != 0)) {
    if (insertArgs_local._4_4_ + recycler._4_4_ != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&_deleteLen_local->head,_rightLimit);
    startSeg = (SparseArraySegment<double> *)0x0;
    prevPrevSeg = &_deleteLen_local->head;
  }
  while (_rightLimit != (SparseArraySegmentBase *)0x0) {
    ((SparseArraySegmentBase *)&_rightLimit->left)->left =
         (((SparseArraySegmentBase *)&_rightLimit->left)->left - (uint32)insertArgs_local) +
         recycler._4_4_;
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
      SparseArraySegmentBase::EnsureSizeInBound(_rightLimit);
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&_rightLimit->next);
    _rightLimit = &SparseArraySegment<double>::From(*ppSVar6)->super_SparseArraySegmentBase;
  }
LAB_010fb138:
  pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr_local->head);
  SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
  if (startSeg != (SparseArraySegment<double> *)0x0) {
    SparseArraySegmentBase::EnsureSizeInBound(&startSeg->super_SparseArraySegmentBase);
  }
  if (recycler._4_4_ != 0) {
    bVar3 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(_deleteLen_local);
    if ((bVar3) ||
       (bVar3 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(_deleteLen_local), bVar3))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d34,
                                  "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                  ,
                                  "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((startSeg != (SparseArraySegment<double> *)0x0) &&
       (insertArgs_local._4_4_ < (startSeg->super_SparseArraySegmentBase).left)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar5 = insertArgs_local._4_4_;
    uVar4 = recycler._4_4_;
    pTVar2 = prevSeg;
    this = startSeg;
    if ((startSeg == (SparseArraySegment<double> *)0x0) ||
       ((startSeg->super_SparseArraySegmentBase).size <=
        insertArgs_local._4_4_ - (startSeg->super_SparseArraySegmentBase).left)) {
      ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)prevPrevSeg);
      pSStack_c0 = &SparseArraySegment<double>::AllocateSegment
                              ((Recycler *)pTVar2,uVar5,uVar4,*ppSVar6)->
                    super_SparseArraySegmentBase;
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pSStack_c0->next,prevPrevSeg);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(prevPrevSeg,pSStack_c0);
      startSeg = (SparseArraySegment<double> *)pSStack_c0;
    }
    else {
      pSStack_c0 = &startSeg->super_SparseArraySegmentBase;
      uVar4 = (startSeg->super_SparseArraySegmentBase).size -
              (insertArgs_local._4_4_ - (startSeg->super_SparseArraySegmentBase).left);
      if (uVar4 < recycler._4_4_) {
        bVar3 = IsInlineSegment(&startSeg->super_SparseArraySegmentBase,_deleteLen_local);
        ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&(this->super_SparseArraySegmentBase).next);
        pTVar2 = prevSeg;
        if (*ppSVar6 == (SparseArraySegmentBase *)0x0) {
          pSStack_c0 = &SparseArraySegment<double>::GrowByMin
                                  (this,(Recycler *)prevSeg,recycler._4_4_ - uVar4)->
                        super_SparseArraySegmentBase;
        }
        else {
          uVar5 = recycler._4_4_ - uVar4;
          pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                             (&(this->super_SparseArraySegmentBase).next);
          pSStack_c0 = &SparseArraySegment<double>::GrowByMinMax
                                  (this,(Recycler *)pTVar2,uVar5,
                                   (pSVar8->left - (this->super_SparseArraySegmentBase).left) -
                                   (this->super_SparseArraySegmentBase).size)->
                        super_SparseArraySegmentBase;
        }
        if (bVar3) {
          (*(_deleteLen_local->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (_deleteLen_local,this,0);
        }
      }
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)savePrev,pSStack_c0);
      pSStack_c0->length = (insertArgs_local._4_4_ + recycler._4_4_) - pSStack_c0->left;
      SparseArraySegmentBase::CheckLengthvsSize(pSStack_c0);
    }
    Memory::CopyArray<double,double,Memory::Recycler>
              ((double *)
               (&pSStack_c0[1].left + (ulong)(insertArgs_local._4_4_ - pSStack_c0->left) * 2),
               (ulong)recycler._4_4_,(double *)ppvStack_28,(ulong)recycler._4_4_);
  }
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }